

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O3

void __thiscall CDemoRecorder::WriteTickMarker(CDemoRecorder *this,int Tick,int Keyframe)

{
  int iVar1;
  uint size;
  byte *buffer;
  IOHANDLE io;
  long in_FS_OFFSET;
  uchar aChunk_1 [1];
  uchar aChunk [5];
  byte local_26;
  byte local_25;
  uchar local_24 [4];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_LastTickMarker == -1) ||
     (iVar1 = Tick - this->m_LastTickMarker, Keyframe != 0 || 0x3f < iVar1)) {
    local_25 = 0x80;
    int_to_bytes_be(local_24,Tick);
    if (Keyframe != 0) {
      local_25 = local_25 | 0x40;
    }
    io = this->m_File;
    buffer = &local_25;
    size = 5;
  }
  else {
    local_26 = (byte)iVar1 | 0x80;
    buffer = &local_26;
    io = this->m_File;
    size = 1;
  }
  io_write(io,buffer,size);
  this->m_LastTickMarker = Tick;
  if (this->m_FirstTick < 0) {
    this->m_FirstTick = Tick;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CDemoRecorder::WriteTickMarker(int Tick, int Keyframe)
{
	if(m_LastTickMarker == -1 || Tick-m_LastTickMarker > 63 || Keyframe)
	{
		unsigned char aChunk[5];
		aChunk[0] = CHUNKTYPEFLAG_TICKMARKER;
		int_to_bytes_be(aChunk+1, Tick);

		if(Keyframe)
			aChunk[0] |= CHUNKTICKFLAG_KEYFRAME;

		io_write(m_File, aChunk, sizeof(aChunk));
	}
	else
	{
		unsigned char aChunk[1];
		aChunk[0] = CHUNKTYPEFLAG_TICKMARKER | (Tick-m_LastTickMarker);
		io_write(m_File, aChunk, sizeof(aChunk));
	}

	m_LastTickMarker = Tick;
	if(m_FirstTick < 0)
		m_FirstTick = Tick;
}